

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O1

sample * __thiscall
Catch::Benchmark::Detail::
jackknife<double(*&)(__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>)>
          (sample *__return_storage_ptr__,Detail *this,
          _func_double___normal_iterator<const_double_ptr,_std::vector<double,_std::allocator<double>_>_>___normal_iterator<const_double_ptr,_std::vector<double,_std::allocator<double>_>_>
          **estimator,iterator first,iterator last)

{
  _func_double___normal_iterator<const_double_ptr,_std::vector<double,_std::allocator<double>_>_>___normal_iterator<const_double_ptr,_std::vector<double,_std::allocator<double>_>_>
  *p_Var1;
  iterator __position;
  double in_RAX;
  _func_double___normal_iterator<const_double_ptr,_std::vector<double,_std::allocator<double>_>_>___normal_iterator<const_double_ptr,_std::vector<double,_std::allocator<double>_>_>
  **pp_Var2;
  double local_38;
  
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38 = in_RAX;
  std::vector<double,_std::allocator<double>_>::reserve
            (__return_storage_ptr__,(long)first._M_current - (long)estimator >> 3);
  if (estimator !=
      (_func_double___normal_iterator<const_double_ptr,_std::vector<double,_std::allocator<double>_>_>___normal_iterator<const_double_ptr,_std::vector<double,_std::allocator<double>_>_>
       **)first._M_current) {
    pp_Var2 = estimator;
    do {
      p_Var1 = *pp_Var2;
      *pp_Var2 = *estimator;
      *estimator = p_Var1;
      local_38 = (double)(**(code **)this)(estimator + 1,first._M_current);
      __position._M_current =
           (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  (__return_storage_ptr__,__position,&local_38);
      }
      else {
        *__position._M_current = local_38;
        (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      pp_Var2 = pp_Var2 + 1;
    } while (pp_Var2 !=
             (_func_double___normal_iterator<const_double_ptr,_std::vector<double,_std::allocator<double>_>_>___normal_iterator<const_double_ptr,_std::vector<double,_std::allocator<double>_>_>
              **)first._M_current);
  }
  return __return_storage_ptr__;
}

Assistant:

sample jackknife(Estimator&& estimator,
                             std::vector<double>::iterator first,
                             std::vector<double>::iterator last) {
                auto n = static_cast<size_t>(last - first);
                auto second = first;
                ++second;
                sample results;
                results.reserve(n);

                for (auto it = first; it != last; ++it) {
                    std::iter_swap(it, first);
                    results.push_back(estimator(second, last));
                }

                return results;
            }